

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O3

int __thiscall Algorithms::jacobiSymbol(Algorithms *this,BigInteger *a,BigInteger *P)

{
  long lVar1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  BigInteger *this_00;
  pointer pBVar7;
  BigInteger p;
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> fact;
  BigInteger local_d0;
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> local_b0;
  BigInteger *local_98;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  local_98 = a;
  BigIntegerLibrary::BigInteger::BigInteger(&local_d0,1);
  bVar3 = BigIntegerLibrary::BigInteger::operator==(P,&local_d0);
  if (local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar6 = 1;
  if (!bVar3) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_50,P);
    factorization(&local_b0,this,&local_50);
    if (local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pBVar2 = local_b0.
             super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar7 = local_b0.
             super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = 1;
    if (local_b0.
        super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b0.
        super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar5 = (long)local_b0.
                    super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b0.
                    super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_b0.
                 super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_b0.
                 super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar7,pBVar2);
      if (local_b0.
          super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b0.
          super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar6 = 1;
        pBVar7 = local_b0.
                 super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          BigIntegerLibrary::BigInteger::BigInteger(&local_d0,pBVar7);
          BigIntegerLibrary::BigInteger::BigInteger(&local_70,local_98);
          this_00 = &local_90;
          BigIntegerLibrary::BigInteger::BigInteger(&local_90,&local_d0);
          iVar4 = legendreSymbol((Algorithms *)this_00,&local_70,&local_90);
          if (local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if (local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if (local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if (iVar4 == 0) {
            iVar6 = 0;
            break;
          }
          iVar6 = iVar6 * iVar4;
          pBVar7 = pBVar7 + 1;
        } while (pBVar7 != local_b0.
                           super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
    ~vector(&local_b0);
  }
  return iVar6;
}

Assistant:

int Algorithms::jacobiSymbol(BigInteger a, BigInteger P) {
    if (P == BigInteger(1)) {
        return 1;
    }
    auto fact = factorization(P);
    sort(fact.begin(), fact.end());
    int ans = 1;
    for (BigInteger p: fact) {
        ans *= legendreSymbol(a, p);
        if (ans == 0) {
            return 0;
        }
    }
    return ans;
}